

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_sub_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  ulong uVar1;
  ushort uVar2;
  int iVar3;
  mbedtls_mpi_uint mVar4;
  long lVar5;
  size_t nblimbs;
  ulong limbs;
  
  uVar1 = (ulong)B->n;
  do {
    limbs = uVar1;
    if (limbs == 0) {
      nblimbs = (size_t)A->n;
      limbs = 0;
      goto LAB_001e71a2;
    }
    uVar1 = limbs - 1;
  } while (B->p[limbs - 1] == 0);
  nblimbs = (size_t)A->n;
  iVar3 = -10;
  if (limbs <= nblimbs) {
LAB_001e71a2:
    iVar3 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar3 == 0) {
      uVar2 = A->n;
      if ((A != X) && (lVar5 = uVar2 - limbs, limbs <= uVar2 && lVar5 != 0)) {
        memcpy(X->p + limbs,A->p + limbs,lVar5 * 8);
        uVar2 = A->n;
      }
      if (uVar2 < X->n) {
        memset(X->p + uVar2,0,((ulong)X->n - (ulong)uVar2) * 8);
      }
      mVar4 = mbedtls_mpi_core_sub(X->p,A->p,B->p,limbs);
      if ((mVar4 == 0) ||
         (mVar4 = mbedtls_mpi_core_sub_int(X->p + limbs,X->p + limbs,mVar4,X->n - limbs),
         iVar3 = -10, mVar4 == 0)) {
        X->s = 1;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_sub_abs(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n;
    mbedtls_mpi_uint carry;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(B != NULL);

    for (n = B->n; n > 0; n--) {
        if (B->p[n - 1] != 0) {
            break;
        }
    }
    if (n > A->n) {
        /* B >= (2^ciL)^n > A */
        ret = MBEDTLS_ERR_MPI_NEGATIVE_VALUE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, A->n));

    /* Set the high limbs of X to match A. Don't touch the lower limbs
     * because X might be aliased to B, and we must not overwrite the
     * significant digits of B. */
    if (A->n > n && A != X) {
        memcpy(X->p + n, A->p + n, (A->n - n) * ciL);
    }
    if (X->n > A->n) {
        memset(X->p + A->n, 0, (X->n - A->n) * ciL);
    }

    carry = mbedtls_mpi_core_sub(X->p, A->p, B->p, n);
    if (carry != 0) {
        /* Propagate the carry through the rest of X. */
        carry = mbedtls_mpi_core_sub_int(X->p + n, X->p + n, carry, X->n - n);

        /* If we have further carry/borrow, the result is negative. */
        if (carry != 0) {
            ret = MBEDTLS_ERR_MPI_NEGATIVE_VALUE;
            goto cleanup;
        }
    }

    /* X should always be positive as a result of unsigned subtractions. */
    X->s = 1;

cleanup:
    return ret;
}